

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

Vec_Int_t * Vec_IntTwoMerge(Vec_Int_t *vArr1,Vec_Int_t *vArr2)

{
  Vec_Int_t *vArr_00;
  Vec_Int_t *vArr;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  vArr_00 = Vec_IntAlloc(vArr1->nSize + vArr2->nSize);
  Vec_IntTwoMerge2Int(vArr1,vArr2,vArr_00);
  return vArr_00;
}

Assistant:

static inline Vec_Int_t * Vec_IntTwoMerge( Vec_Int_t * vArr1, Vec_Int_t * vArr2 )
{
    Vec_Int_t * vArr = Vec_IntAlloc( vArr1->nSize + vArr2->nSize ); 
    Vec_IntTwoMerge2Int( vArr1, vArr2, vArr );
    return vArr;
}